

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O0

string_view absl::StripAsciiWhitespace(string_view str)

{
  string_view str_00;
  char *in_RDI;
  string_view sVar1;
  char *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_fffffffffffffff8;
  
  sVar1._M_str = in_RDI;
  sVar1._M_len = in_stack_ffffffffffffffd8;
  StripLeadingAsciiWhitespace(sVar1);
  str_00._M_str = unaff_retaddr;
  str_00._M_len = in_stack_fffffffffffffff8;
  sVar1 = StripTrailingAsciiWhitespace(str_00);
  return sVar1;
}

Assistant:

ABSL_MUST_USE_RESULT inline absl::string_view StripAsciiWhitespace(
    absl::string_view str) {
  return StripTrailingAsciiWhitespace(StripLeadingAsciiWhitespace(str));
}